

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void wiz_hack_map_query_square_flag
               (chunk *c,void *closure,loc_conflict grid,_Bool *show,uint8_t *color)

{
  int flag_00;
  _Bool _Var1;
  uint8_t uVar2;
  square_conflict *psVar3;
  wchar_t flag;
  uint8_t *color_local;
  _Bool *show_local;
  void *closure_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  flag_00 = *closure;
  if (flag_00 != 0) {
    psVar3 = square(c,grid);
    _Var1 = flag_has_dbg(psVar3->info,3,flag_00,"square(c, grid)->info","flag");
    if (_Var1) goto LAB_00144d34;
  }
  if ((flag_00 != 0) || (_Var1 = square_isknown(c,grid), !_Var1)) {
    *show = false;
    return;
  }
LAB_00144d34:
  *show = true;
  _Var1 = square_ispassable(c,grid);
  uVar2 = '\x04';
  if (_Var1) {
    uVar2 = '\v';
  }
  *color = uVar2;
  return;
}

Assistant:

static void wiz_hack_map_query_square_flag(struct chunk *c, void *closure,
	struct loc grid, bool *show, uint8_t *color)
{
	int flag = *((int*)closure);

	/* With a flag, test for that.  Otherwise, test if grid is known. */
	if ((flag && sqinfo_has(square(c, grid)->info, flag)) ||
			(!flag && square_isknown(c, grid))) {
		*show = true;
		*color = (square_ispassable(c, grid)) ?
			COLOUR_YELLOW : COLOUR_RED;
	} else {
		*show = false;
	}
}